

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SGDOptimizer::MergeFrom(SGDOptimizer *this,SGDOptimizer *from)

{
  void *pvVar1;
  LogMessage *other;
  DoubleParameter *pDVar2;
  Int64Parameter *this_00;
  DoubleParameter *pDVar3;
  Int64Parameter *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x1240c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pDVar3 = from->learningrate_;
  if (pDVar3 != (DoubleParameter *)0x0 && from != (SGDOptimizer *)&_SGDOptimizer_default_instance_)
  {
    pDVar2 = this->learningrate_;
    if (pDVar2 == (DoubleParameter *)0x0) {
      pDVar2 = (DoubleParameter *)operator_new(0x28);
      DoubleParameter::DoubleParameter(pDVar2);
      this->learningrate_ = pDVar2;
      pDVar3 = from->learningrate_;
    }
    if (pDVar3 == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)&_DoubleParameter_default_instance_;
    }
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  from_00 = from->minibatchsize_;
  if (from_00 != (Int64Parameter *)0x0 && from != (SGDOptimizer *)&_SGDOptimizer_default_instance_)
  {
    this_00 = this->minibatchsize_;
    if (this_00 == (Int64Parameter *)0x0) {
      this_00 = (Int64Parameter *)operator_new(0x28);
      Int64Parameter::Int64Parameter(this_00);
      this->minibatchsize_ = this_00;
      from_00 = from->minibatchsize_;
    }
    if (from_00 == (Int64Parameter *)0x0) {
      from_00 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this_00,from_00);
  }
  pDVar3 = from->momentum_;
  if (pDVar3 != (DoubleParameter *)0x0 && from != (SGDOptimizer *)&_SGDOptimizer_default_instance_)
  {
    pDVar2 = this->momentum_;
    if (pDVar2 == (DoubleParameter *)0x0) {
      pDVar2 = (DoubleParameter *)operator_new(0x28);
      DoubleParameter::DoubleParameter(pDVar2);
      this->momentum_ = pDVar2;
      pDVar3 = from->momentum_;
    }
    if (pDVar3 == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)&_DoubleParameter_default_instance_;
    }
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  return;
}

Assistant:

void SGDOptimizer::MergeFrom(const SGDOptimizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.SGDOptimizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_learningrate()) {
    mutable_learningrate()->::CoreML::Specification::DoubleParameter::MergeFrom(from.learningrate());
  }
  if (from.has_minibatchsize()) {
    mutable_minibatchsize()->::CoreML::Specification::Int64Parameter::MergeFrom(from.minibatchsize());
  }
  if (from.has_momentum()) {
    mutable_momentum()->::CoreML::Specification::DoubleParameter::MergeFrom(from.momentum());
  }
}